

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError BuildDeviceList(PaAlsaHostApiRepresentation *alsaApi)

{
  PaUtilAllocationGroup *pPVar1;
  char *pcVar2;
  byte *pbVar3;
  snd_ctl_t *psVar4;
  PaAlsaHostApiRepresentation *pPVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  byte *pbVar13;
  byte *pbVar14;
  PaAlsaDeviceInfo *pPVar15;
  long lVar16;
  undefined8 uVar17;
  PaDeviceInfo **ppPVar18;
  pthread_t pVar19;
  undefined4 uVar20;
  int __pa_unsure_error_id;
  PaError PVar21;
  snd_config_t *psVar22;
  char *pcVar23;
  char *pcVar24;
  byte bVar25;
  byte *pbVar26;
  HwDevInfo *pHVar27;
  ulong uVar28;
  char *pcVar29;
  long lVar30;
  ulong uVar31;
  bool bVar32;
  ulong uStack_130;
  char local_128 [8];
  char alsaCardName [50];
  char *local_e8;
  char buf [50];
  char *local_a8;
  char *alsaDeviceName;
  char *local_98;
  undefined8 local_90;
  snd_config_t *topNode;
  ulong local_80;
  PaAlsaDeviceInfo *local_78;
  undefined8 uStack_70;
  int local_68;
  uint local_64;
  PaAlsaHostApiRepresentation *local_60;
  int local_58;
  uint local_54;
  int devIdx_1;
  char *cardName;
  snd_ctl_t *ctl;
  int local_34 [2];
  int devIdx;
  
  local_34[0] = 0;
  local_90 = 0;
  uStack_130 = 0x10cd53;
  pcVar10 = getenv("PA_ALSA_INITIALIZE_BLOCK");
  if (pcVar10 == (char *)0x0) {
    local_54 = 1;
  }
  else {
    uStack_130 = 0x10cd60;
    iVar6 = atoi(pcVar10);
    local_54 = (uint)(iVar6 == 0);
  }
  uStack_130 = 0x10cd7e;
  pcVar10 = getenv("PA_ALSA_PLUGHW");
  if (pcVar10 == (char *)0x0) {
    local_64 = 0;
    topNode = (snd_config_t *)0x115e2a;
  }
  else {
    uStack_130 = 0x10cd8b;
    iVar6 = atoi(pcVar10);
    local_64 = (uint)(iVar6 != 0);
    topNode = (snd_config_t *)0x115e2a;
    if (iVar6 != 0) {
      topNode = (snd_config_t *)"plug";
    }
  }
  (alsaApi->baseHostApiRep).info.defaultInputDevice = -1;
  (alsaApi->baseHostApiRep).info.defaultOutputDevice = -1;
  local_68 = -1;
  uStack_130 = 0x10cdd0;
  sVar11 = snd_ctl_card_info_sizeof();
  lVar30 = -(sVar11 + 0xf & 0xfffffffffffffff0);
  pcVar29 = local_128 + lVar30;
  pcVar23 = local_128 + lVar30 + -8;
  alsaDeviceName = pcVar29;
  pcVar23[0] = -0xe;
  pcVar23[1] = -0x33;
  pcVar23[2] = '\x10';
  pcVar23[3] = '\0';
  pcVar23[4] = '\0';
  pcVar23[5] = '\0';
  pcVar23[6] = '\0';
  pcVar23[7] = '\0';
  memset(pcVar29,0,sVar11);
  pcVar24 = local_128 + lVar30 + -8;
  pcVar24[0] = -9;
  pcVar24[1] = -0x33;
  pcVar24[2] = '\x10';
  pcVar24[3] = '\0';
  pcVar24[4] = '\0';
  pcVar24[5] = '\0';
  pcVar24[6] = '\0';
  pcVar24[7] = '\0';
  sVar11 = snd_pcm_info_sizeof();
  pcVar29 = pcVar29 + -(sVar11 + 0xf & 0xfffffffffffffff0);
  pcVar29[-8] = '\x15';
  pcVar29[-7] = -0x32;
  pcVar29[-6] = '\x10';
  pcVar29[-5] = '\0';
  pcVar29[-4] = '\0';
  pcVar29[-3] = '\0';
  pcVar29[-2] = '\0';
  pcVar29[-1] = '\0';
  memset(pcVar29,0,sVar11);
  pcVar29[-8] = '\x01';
  pcVar29[-7] = '\0';
  pcVar29[-6] = '\0';
  pcVar29[-5] = '\0';
  pcVar29[-4] = '\0';
  pcVar29[-3] = '\0';
  pcVar29[-2] = '\0';
  pcVar29[-1] = '\0';
  local_80 = *(ulong *)(pcVar29 + -8);
  ctl = (snd_ctl_t *)0x0;
  uVar31 = 0;
  pcVar10 = pcVar29;
  local_98 = pcVar29;
  local_60 = alsaApi;
  while( true ) {
    pcVar29[-8] = 'B';
    pcVar29[-7] = -0x32;
    pcVar29[-6] = '\x10';
    pcVar29[-5] = '\0';
    pcVar29[-4] = '\0';
    pcVar29[-3] = '\0';
    pcVar29[-2] = '\0';
    pcVar29[-1] = '\0';
    iVar6 = snd_card_next(&local_68);
    if ((iVar6 != 0) || (local_68 < 0)) break;
    local_58 = -1;
    pcVar29[-8] = '2';
    pcVar29[-7] = '\0';
    pcVar29[-6] = '\0';
    pcVar29[-5] = '\0';
    pcVar29[-4] = '\0';
    pcVar29[-3] = '\0';
    pcVar29[-2] = '\0';
    pcVar29[-1] = '\0';
    sVar11 = *(size_t *)(pcVar29 + -8);
    pcVar29[-8] = 't';
    pcVar29[-7] = -0x32;
    pcVar29[-6] = '\x10';
    pcVar29[-5] = '\0';
    pcVar29[-4] = '\0';
    pcVar29[-3] = '\0';
    pcVar29[-2] = '\0';
    pcVar29[-1] = '\0';
    snprintf(local_128,sVar11,"hw:%d");
    pcVar29[-8] = -0x7e;
    pcVar29[-7] = -0x32;
    pcVar29[-6] = '\x10';
    pcVar29[-5] = '\0';
    pcVar29[-4] = '\0';
    pcVar29[-3] = '\0';
    pcVar29[-2] = '\0';
    pcVar29[-1] = '\0';
    iVar6 = snd_ctl_open(&cardName,local_128,0);
    pcVar2 = cardName;
    pcVar12 = alsaDeviceName;
    if (-1 < iVar6) {
      pcVar29[-8] = -0x67;
      pcVar29[-7] = -0x32;
      pcVar29[-6] = '\x10';
      pcVar29[-5] = '\0';
      pcVar29[-4] = '\0';
      pcVar29[-3] = '\0';
      pcVar29[-2] = '\0';
      pcVar29[-1] = '\0';
      snd_ctl_card_info(pcVar2,pcVar12);
      pcVar29[-8] = -0x5f;
      pcVar29[-7] = -0x32;
      pcVar29[-6] = '\x10';
      pcVar29[-5] = '\0';
      pcVar29[-4] = '\0';
      pcVar29[-3] = '\0';
      pcVar29[-2] = '\0';
      pcVar29[-1] = '\0';
      pcVar12 = (char *)snd_ctl_card_info_get_name(pcVar12);
      pcVar29[-8] = -0x50;
      pcVar29[-7] = -0x32;
      pcVar29[-6] = '\x10';
      pcVar29[-5] = '\0';
      pcVar29[-4] = '\0';
      pcVar29[-3] = '\0';
      pcVar29[-2] = '\0';
      pcVar29[-1] = '\0';
      paUtilErr_ = PaAlsa_StrDup(alsaApi,(char **)&devIdx_1,pcVar12);
      if (paUtilErr_ < 0) {
        pcVar10 = 
        "Expression \'PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo ))\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1296\n"
        ;
LAB_0010d4b3:
        pcVar29[-8] = -0x46;
        pcVar29[-7] = -0x2c;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        PaUtil_DebugPrint(pcVar10);
        return paUtilErr_;
      }
      while( true ) {
        pcVar12 = cardName;
        pcVar29[-8] = -0x35;
        pcVar29[-7] = -0x32;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        iVar6 = snd_ctl_pcm_next_device(pcVar12,&local_58);
        pcVar12 = cardName;
        if ((iVar6 != 0) || (local_58 < 0)) break;
        pcVar29[-8] = '2';
        psVar22 = topNode;
        pcVar29[-7] = '\0';
        pcVar29[-6] = '\0';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        sVar11 = *(size_t *)(pcVar29 + -8);
        pcVar29[-8] = -1;
        pcVar29[-7] = -0x32;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        snprintf((char *)&local_e8,sVar11,"%s%s,%d",psVar22,local_128);
        iVar6 = local_58;
        pcVar29[-8] = '\n';
        pcVar29[-7] = -0x31;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        snd_pcm_info_set_device(pcVar10,iVar6);
        pcVar29[-8] = '\x14';
        pcVar29[-7] = -0x31;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        snd_pcm_info_set_subdevice(pcVar10,0);
        pcVar29[-8] = '\x01';
        pcVar29[-7] = '\0';
        pcVar29[-6] = '\0';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        uVar17 = *(undefined8 *)(pcVar29 + -8);
        pcVar29[-8] = '\x1f';
        pcVar29[-7] = -0x31;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        snd_pcm_info_set_stream(pcVar10,uVar17);
        pcVar12 = cardName;
        pcVar29[-8] = '+';
        pcVar29[-7] = -0x31;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        uVar7 = snd_ctl_pcm_info(pcVar12,pcVar10);
        pcVar29[-8] = '7';
        pcVar29[-7] = -0x31;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        snd_pcm_info_set_stream(pcVar10,0);
        pcVar12 = cardName;
        pcVar29[-8] = 'C';
        pcVar29[-7] = -0x31;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        uVar8 = snd_ctl_pcm_info(pcVar12,pcVar10);
        if (-1 < (int)(uVar8 & uVar7)) {
          local_78 = (PaAlsaDeviceInfo *)CONCAT44(uVar7,uVar8);
          uStack_70 = 0;
          pcVar29[-8] = 'd';
          pcVar29[-7] = -0x31;
          pcVar29[-6] = '\x10';
          pcVar29[-5] = '\0';
          pcVar29[-4] = '\0';
          pcVar29[-3] = '\0';
          pcVar29[-2] = '\0';
          pcVar29[-1] = '\0';
          pbVar13 = (byte *)snd_pcm_info_get_name();
          pbVar3 = _devIdx_1;
          pbVar26 = _devIdx_1;
LAB_0010cf72:
          bVar25 = *pbVar13;
          pbVar14 = pbVar13;
          if (*pbVar26 != 0) {
            while ((bVar25 != 0 && (bVar25 == *pbVar26))) {
              pbVar26 = pbVar26 + 1;
              bVar25 = pbVar14[1];
              pbVar14 = pbVar14 + 1;
              if ((bVar25 & 0xdf) == 0) {
                pbVar13 = pbVar14;
              }
            }
            do {
              bVar25 = *pbVar26;
              if (bVar25 == 0) break;
              pbVar26 = pbVar26 + 1;
            } while (bVar25 != 0x20);
            goto LAB_0010cf72;
          }
          pbVar26 = (byte *)"-";
          if (bVar25 != 0) {
            while (bVar25 == 0x20) {
              pbVar26 = pbVar13 + 1;
              pbVar13 = pbVar13 + 1;
              bVar25 = *pbVar26;
            }
            if ((bVar25 == 0x2d) || (pbVar26 = pbVar13, bVar25 == 0x3a)) {
              pbVar26 = pbVar13 + (ulong)(pbVar13[1] == 0x20) * 2;
            }
          }
          pcVar29[-8] = -3;
          pcVar29[-7] = -0x31;
          pcVar29[-6] = '\x10';
          pcVar29[-5] = '\0';
          pcVar29[-4] = '\0';
          pcVar29[-3] = '\0';
          pcVar29[-2] = '\0';
          pcVar29[-1] = '\0';
          iVar6 = snprintf((char *)0x0,0,"%s: %s (%s)",pbVar3,pbVar26,&local_e8);
          pPVar1 = local_60->allocations;
          pcVar29[-8] = '\x18';
          pcVar29[-7] = -0x30;
          pcVar29[-6] = '\x10';
          pcVar29[-5] = '\0';
          pcVar29[-4] = '\0';
          pcVar29[-3] = '\0';
          pcVar29[-2] = '\0';
          pcVar29[-1] = '\0';
          pcVar12 = (char *)PaUtil_GroupAllocateMemory(pPVar1,(long)(iVar6 + 1));
          pbVar3 = _devIdx_1;
          if (pcVar12 == (char *)0x0) {
            pcVar10 = 
            "Expression \'deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1332\n"
            ;
            goto LAB_0010d514;
          }
          pcVar29[-8] = 'B';
          pcVar29[-7] = -0x30;
          pcVar29[-6] = '\x10';
          pcVar29[-5] = '\0';
          pcVar29[-4] = '\0';
          pcVar29[-3] = '\0';
          pcVar29[-2] = '\0';
          pcVar29[-1] = '\0';
          snprintf(pcVar12,(long)(iVar6 + 1),"%s: %s (%s)",pbVar3,pbVar26,&local_e8);
          psVar4 = ctl;
          uVar28 = local_80;
          if (local_80 < uVar31 + 1 || ctl == (snd_ctl_t *)0x0) {
            sVar11 = local_80 << 6;
            pcVar29[-8] = 'p';
            pcVar29[-7] = -0x30;
            pcVar29[-6] = '\x10';
            pcVar29[-5] = '\0';
            pcVar29[-4] = '\0';
            pcVar29[-3] = '\0';
            pcVar29[-2] = '\0';
            pcVar29[-1] = '\0';
            ctl = (snd_ctl_t *)realloc(psVar4,sVar11);
            if (ctl == (snd_ctl_t *)0x0) {
              pcVar10 = 
              "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1342\n"
              ;
              goto LAB_0010d514;
            }
            local_80 = uVar28 * 2;
          }
          alsaApi = local_60;
          pcVar10 = local_98;
          pcVar29[-8] = -0x4b;
          pcVar29[-7] = -0x30;
          pcVar29[-6] = '\x10';
          pcVar29[-5] = '\0';
          pcVar29[-4] = '\0';
          pcVar29[-3] = '\0';
          pcVar29[-2] = '\0';
          pcVar29[-1] = '\0';
          paUtilErr_ = PaAlsa_StrDup(alsaApi,&local_a8,(char *)&local_e8);
          if (paUtilErr_ < 0) {
            pcVar10 = 
            "Expression \'PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1345\n"
            ;
            goto LAB_0010d4b3;
          }
          lVar30 = uVar31 * 0x20;
          *(char **)(ctl + lVar30) = local_a8;
          *(char **)(ctl + lVar30 + 8) = pcVar12;
          *(uint *)(ctl + lVar30 + 0x10) = local_64;
          *(ulong *)(ctl + lVar30 + 0x14) =
               CONCAT44(-(uint)(-1 < (long)local_78) >> 0x1f,-(uint)(-1 < (int)local_78) >> 0x1f);
          uVar31 = uVar31 + 1;
        }
      }
      pcVar29[-8] = '\x14';
      pcVar29[-7] = -0x2f;
      pcVar29[-6] = '\x10';
      pcVar29[-5] = '\0';
      pcVar29[-4] = '\0';
      pcVar29[-3] = '\0';
      pcVar29[-2] = '\0';
      pcVar29[-1] = '\0';
      snd_ctl_close(pcVar12);
    }
  }
  if (_snd_config == 0) {
    pcVar29[-8] = '-';
    pcVar29[-7] = -0x2f;
    pcVar29[-6] = '\x10';
    pcVar29[-5] = '\0';
    pcVar29[-4] = '\0';
    pcVar29[-3] = '\0';
    pcVar29[-2] = '\0';
    pcVar29[-1] = '\0';
    iVar6 = snd_config_update();
    if (iVar6 < 0) {
      pcVar29[-8] = -0x34;
      pcVar29[-7] = -0x2b;
      pcVar29[-6] = '\x10';
      pcVar29[-5] = '\0';
      pcVar29[-4] = '\0';
      pcVar29[-3] = '\0';
      pcVar29[-2] = '\0';
      pcVar29[-1] = '\0';
      pVar19 = pthread_self();
      pcVar29[-8] = -0x22;
      pcVar29[-7] = -0x2b;
      pcVar29[-6] = '\x10';
      pcVar29[-5] = '\0';
      pcVar29[-4] = '\0';
      pcVar29[-3] = '\0';
      pcVar29[-2] = '\0';
      pcVar29[-1] = '\0';
      iVar9 = pthread_equal(pVar19,paUnixMainThread);
      if (iVar9 != 0) {
        pcVar29[-8] = -0x14;
        pcVar29[-7] = -0x2b;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        pcVar10 = (char *)snd_strerror(iVar6);
        pcVar29[-8] = '\b';
        pcVar29[-7] = '\0';
        pcVar29[-6] = '\0';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        uVar17 = *(undefined8 *)(pcVar29 + -8);
        pcVar29[-8] = -6;
        pcVar29[-7] = -0x2b;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar17,(long)iVar6,pcVar10);
      }
      pcVar29[-8] = '\b';
      pcVar29[-7] = -0x2a;
      pcVar29[-6] = '\x10';
      pcVar29[-5] = '\0';
      pcVar29[-4] = '\0';
      pcVar29[-3] = '\0';
      pcVar29[-2] = '\0';
      pcVar29[-1] = '\0';
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_config_update()\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1360\n"
                       );
      return -9999;
    }
    if (_snd_config == 0) {
      *(code **)(pcVar29 + -8) = CloseStream;
      __assert_fail("*alsa_snd_config",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0x553,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *)");
    }
  }
  pcVar29[-8] = 'T';
  pcVar29[-7] = -0x2f;
  pcVar29[-6] = '\x10';
  pcVar29[-5] = '\0';
  pcVar29[-4] = '\0';
  pcVar29[-3] = '\0';
  pcVar29[-2] = '\0';
  pcVar29[-1] = '\0';
  iVar6 = snd_config_search(_snd_config,"pcm",&local_90);
  uVar17 = local_90;
  if (-1 < iVar6) {
    pcVar29[-8] = 'h';
    pcVar29[-7] = -0x2f;
    pcVar29[-6] = '\x10';
    pcVar29[-5] = '\0';
    pcVar29[-4] = '\0';
    pcVar29[-3] = '\0';
    pcVar29[-2] = '\0';
    pcVar29[-1] = '\0';
    pPVar15 = (PaAlsaDeviceInfo *)snd_config_iterator_first(uVar17);
    topNode = (snd_config_t *)paHostApiInitializers;
    pPVar5 = alsaApi;
LAB_0010d181:
    alsaApi = pPVar5;
    pcVar29[-8] = -0x77;
    pcVar29[-7] = -0x2f;
    pcVar29[-6] = '\x10';
    pcVar29[-5] = '\0';
    pcVar29[-4] = '\0';
    pcVar29[-3] = '\0';
    pcVar29[-2] = '\0';
    pcVar29[-1] = '\0';
    lVar30 = snd_config_iterator_next(pPVar15);
    uVar17 = local_90;
    pcVar29[-8] = -0x68;
    pcVar29[-7] = -0x2f;
    pcVar29[-6] = '\x10';
    pcVar29[-5] = '\0';
    pcVar29[-4] = '\0';
    pcVar29[-3] = '\0';
    pcVar29[-2] = '\0';
    pcVar29[-1] = '\0';
    lVar16 = snd_config_iterator_end(uVar17);
    if (pPVar15 != (PaAlsaDeviceInfo *)lVar16) {
      local_e8 = "unknown";
      _devIdx_1 = (byte *)0x0;
      local_78 = (PaAlsaDeviceInfo *)lVar30;
      pcVar29[-8] = -0x47;
      pcVar29[-7] = -0x2f;
      pcVar29[-6] = '\x10';
      pcVar29[-5] = '\0';
      pcVar29[-4] = '\0';
      pcVar29[-3] = '\0';
      pcVar29[-2] = '\0';
      pcVar29[-1] = '\0';
      uVar17 = snd_config_iterator_entry(pPVar15);
      cardName = (char *)0x0;
      pcVar29[-8] = -0x2c;
      pcVar29[-7] = -0x2f;
      pcVar29[-6] = '\x10';
      pcVar29[-5] = '\0';
      pcVar29[-4] = '\0';
      pcVar29[-3] = '\0';
      pcVar29[-2] = '\0';
      pcVar29[-1] = '\0';
      iVar6 = snd_config_search(uVar17,"type",&cardName);
      pcVar10 = cardName;
      if (iVar6 < 0) {
        if (iVar6 != -2) {
          pcVar29[-8] = -0x39;
          pcVar29[-7] = -0x2c;
          pcVar29[-6] = '\x10';
          pcVar29[-5] = '\0';
          pcVar29[-4] = '\0';
          pcVar29[-3] = '\0';
          pcVar29[-2] = '\0';
          pcVar29[-1] = '\0';
          pVar19 = pthread_self();
          pcVar29[-8] = -0x27;
          pcVar29[-7] = -0x2c;
          pcVar29[-6] = '\x10';
          pcVar29[-5] = '\0';
          pcVar29[-4] = '\0';
          pcVar29[-3] = '\0';
          pcVar29[-2] = '\0';
          pcVar29[-1] = '\0';
          iVar9 = pthread_equal(pVar19,paUnixMainThread);
          pcVar10 = 
          "Expression \'err\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1381\n"
          ;
          goto LAB_0010d4e0;
        }
      }
      else {
        pcVar29[-8] = -0x18;
        pcVar29[-7] = -0x2f;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        iVar6 = snd_config_get_string(pcVar10,&local_e8);
        if (iVar6 < 0) {
          pcVar29[-8] = 'f';
          pcVar29[-7] = -0x2b;
          pcVar29[-6] = '\x10';
          pcVar29[-5] = '\0';
          pcVar29[-4] = '\0';
          pcVar29[-3] = '\0';
          pcVar29[-2] = '\0';
          pcVar29[-1] = '\0';
          pVar19 = pthread_self();
          pcVar29[-8] = 'x';
          pcVar29[-7] = -0x2b;
          pcVar29[-6] = '\x10';
          pcVar29[-5] = '\0';
          pcVar29[-4] = '\0';
          pcVar29[-3] = '\0';
          pcVar29[-2] = '\0';
          pcVar29[-1] = '\0';
          iVar9 = pthread_equal(pVar19,paUnixMainThread);
          pcVar10 = 
          "Expression \'alsa_snd_config_get_string( tp, &tpStr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1386\n"
          ;
          goto LAB_0010d4e0;
        }
      }
      pcVar29[-8] = '\b';
      pcVar29[-7] = -0x2e;
      pcVar29[-6] = '\x10';
      pcVar29[-5] = '\0';
      pcVar29[-4] = '\0';
      pcVar29[-3] = '\0';
      pcVar29[-2] = '\0';
      pcVar29[-1] = '\0';
      iVar6 = snd_config_get_id(uVar17,&devIdx_1);
      pbVar3 = _devIdx_1;
      if (iVar6 < 0) {
        pcVar29[-8] = 'D';
        pcVar29[-7] = -0x2b;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        pVar19 = pthread_self();
        pcVar29[-8] = 'V';
        pcVar29[-7] = -0x2b;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        iVar9 = pthread_equal(pVar19,paUnixMainThread);
        pcVar10 = 
        "Expression \'alsa_snd_config_get_id( n, &idStr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1388\n"
        ;
LAB_0010d4e0:
        if (iVar9 != 0) {
          pcVar29[-8] = -0x12;
          pcVar29[-7] = -0x2c;
          pcVar29[-6] = '\x10';
          pcVar29[-5] = '\0';
          pcVar29[-4] = '\0';
          pcVar29[-3] = '\0';
          pcVar29[-2] = '\0';
          pcVar29[-1] = '\0';
          pcVar12 = (char *)snd_strerror(iVar6);
          pcVar29[-8] = '\b';
          pcVar29[-7] = '\0';
          pcVar29[-6] = '\0';
          pcVar29[-5] = '\0';
          pcVar29[-4] = '\0';
          pcVar29[-3] = '\0';
          pcVar29[-2] = '\0';
          pcVar29[-1] = '\0';
          uVar17 = *(undefined8 *)(pcVar29 + -8);
          pcVar29[-8] = -4;
          pcVar29[-7] = -0x2c;
          pcVar29[-6] = '\x10';
          pcVar29[-5] = '\0';
          pcVar29[-4] = '\0';
          pcVar29[-3] = '\0';
          pcVar29[-2] = '\0';
          pcVar29[-1] = '\0';
          PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar17,(long)iVar6,pcVar12);
        }
        PVar21 = -9999;
LAB_0010d501:
        pcVar29[-8] = '\v';
        pcVar29[-7] = -0x2b;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        PaUtil_DebugPrint(pcVar10);
        return PVar21;
      }
      pcVar29[-8] = ' ';
      pcVar29[-7] = -0x2e;
      pcVar29[-6] = '\x10';
      pcVar29[-5] = '\0';
      pcVar29[-4] = '\0';
      pcVar29[-3] = '\0';
      pcVar29[-2] = '\0';
      pcVar29[-1] = '\0';
      pcVar10 = getenv("PA_ALSA_IGNORE_ALL_PLUGINS");
      if (pcVar10 != (char *)0x0) goto code_r0x0010d225;
      goto LAB_0010d231;
    }
  }
  pPVar1 = alsaApi->allocations;
  pcVar29[-8] = -0x74;
  pcVar29[-7] = -0x2d;
  pcVar29[-6] = '\x10';
  pcVar29[-5] = '\0';
  pcVar29[-4] = '\0';
  pcVar29[-3] = '\0';
  pcVar29[-2] = '\0';
  pcVar29[-1] = '\0';
  ppPVar18 = (PaDeviceInfo **)PaUtil_GroupAllocateMemory(pPVar1,uVar31 * 8);
  (alsaApi->baseHostApiRep).deviceInfos = ppPVar18;
  if (ppPVar18 == (PaDeviceInfo **)0x0) {
    pcVar10 = 
    "Expression \'baseApi->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1434\n"
    ;
  }
  else {
    pPVar1 = alsaApi->allocations;
    pcVar29[-8] = -0x57;
    pcVar29[-7] = -0x2d;
    pcVar29[-6] = '\x10';
    pcVar29[-5] = '\0';
    pcVar29[-4] = '\0';
    pcVar29[-3] = '\0';
    pcVar29[-2] = '\0';
    pcVar29[-1] = '\0';
    pPVar15 = (PaAlsaDeviceInfo *)PaUtil_GroupAllocateMemory(pPVar1,uVar31 * 0x60);
    if (pPVar15 != (PaAlsaDeviceInfo *)0x0) {
      local_34[0] = 0;
      uVar28 = uVar31;
      pHVar27 = (HwDevInfo *)ctl;
      local_78 = pPVar15;
      while (pPVar5 = local_60, bVar32 = uVar28 != 0, uVar28 = uVar28 - 1, bVar32) {
        pcVar10 = pHVar27->name;
        pcVar29[-8] = -0x20;
        pcVar29[-7] = -0x2d;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        iVar6 = strcmp(pcVar10,"dmix");
        if (iVar6 != 0) {
          pcVar29[-8] = -0xd;
          pcVar29[-7] = -0x2d;
          pcVar29[-6] = '\x10';
          pcVar29[-5] = '\0';
          pcVar29[-4] = '\0';
          pcVar29[-3] = '\0';
          pcVar29[-2] = '\0';
          pcVar29[-1] = '\0';
          iVar6 = strcmp(pcVar10,"default");
          uVar7 = local_54;
          pPVar5 = local_60;
          if (iVar6 != 0) {
            pcVar29[-8] = '\r';
            pcVar29[-7] = -0x2c;
            pcVar29[-6] = '\x10';
            pcVar29[-5] = '\0';
            pcVar29[-4] = '\0';
            pcVar29[-3] = '\0';
            pcVar29[-2] = '\0';
            pcVar29[-1] = '\0';
            FillInDevInfo(pPVar5,pHVar27,uVar7,pPVar15,local_34);
            paUtilErr_ = 0;
          }
        }
        pPVar15 = pPVar15 + 1;
        pHVar27 = pHVar27 + 1;
      }
      pHVar27 = (HwDevInfo *)ctl;
      if (uVar31 < (ulong)(long)local_34[0]) {
        pcVar29[-8] = '1';
        pcVar29[-7] = -0x2a;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        __assert_fail("devIdx <= numDeviceNames",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x5b4,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *)");
      }
      do {
        psVar4 = ctl;
        bVar32 = uVar31 == 0;
        uVar31 = uVar31 - 1;
        if (bVar32) {
          pcVar29[-8] = -0x68;
          pcVar29[-7] = -0x2c;
          pcVar29[-6] = '\x10';
          pcVar29[-5] = '\0';
          pcVar29[-4] = '\0';
          pcVar29[-3] = '\0';
          pcVar29[-2] = '\0';
          pcVar29[-1] = '\0';
          free(psVar4);
          (pPVar5->baseHostApiRep).info.deviceCount = local_34[0];
          return 0;
        }
        pcVar10 = pHVar27->name;
        pcVar29[-8] = 'P';
        pcVar29[-7] = -0x2c;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        iVar6 = strcmp(pcVar10,"dmix");
        if (iVar6 == 0) {
LAB_0010d467:
          uVar7 = local_54;
          pPVar15 = local_78;
          pcVar29[-8] = '}';
          pcVar29[-7] = -0x2c;
          pcVar29[-6] = '\x10';
          pcVar29[-5] = '\0';
          pcVar29[-4] = '\0';
          pcVar29[-3] = '\0';
          pcVar29[-2] = '\0';
          pcVar29[-1] = '\0';
          FillInDevInfo(pPVar5,pHVar27,uVar7,pPVar15,local_34);
          paUtilErr_ = 0;
        }
        else {
          pcVar29[-8] = 'c';
          pcVar29[-7] = -0x2c;
          pcVar29[-6] = '\x10';
          pcVar29[-5] = '\0';
          pcVar29[-4] = '\0';
          pcVar29[-3] = '\0';
          pcVar29[-2] = '\0';
          pcVar29[-1] = '\0';
          iVar6 = strcmp(pcVar10,"default");
          if (iVar6 == 0) goto LAB_0010d467;
        }
        local_78 = local_78 + 1;
        pHVar27 = pHVar27 + 1;
      } while( true );
    }
    pcVar10 = 
    "Expression \'deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1438\n"
    ;
  }
LAB_0010d514:
  pcVar29[-8] = '\x1b';
  pcVar29[-7] = -0x2b;
  pcVar29[-6] = '\x10';
  pcVar29[-5] = '\0';
  pcVar29[-4] = '\0';
  pcVar29[-3] = '\0';
  pcVar29[-2] = '\0';
  pcVar29[-1] = '\0';
  PaUtil_DebugPrint(pcVar10);
  return -0x2708;
code_r0x0010d225:
  pcVar29[-8] = '-';
  pcVar29[-7] = -0x2e;
  pcVar29[-6] = '\x10';
  pcVar29[-5] = '\0';
  pcVar29[-4] = '\0';
  pcVar29[-3] = '\0';
  pcVar29[-2] = '\0';
  pcVar29[-1] = '\0';
  iVar6 = atoi(pcVar10);
  pPVar15 = local_78;
  pPVar5 = local_60;
  if (iVar6 == 0) {
LAB_0010d231:
    lVar30 = 0;
    do {
      if (lVar30 == 0x50) {
        pPVar1 = alsaApi->allocations;
        pcVar29[-8] = 'p';
        pcVar29[-7] = -0x2e;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        sVar11 = strlen((char *)pbVar3);
        pcVar29[-8] = '|';
        pcVar29[-7] = -0x2e;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        pcVar10 = (char *)PaUtil_GroupAllocateMemory(pPVar1,sVar11 + 6);
        pbVar3 = _devIdx_1;
        PVar21 = -0x2708;
        if (pcVar10 == (char *)0x0) {
          pcVar10 = 
          "Expression \'alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 6 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1397\n"
          ;
          goto LAB_0010d501;
        }
        pcVar29[-8] = -0x67;
        pcVar29[-7] = -0x2e;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        strcpy(pcVar10,(char *)pbVar3);
        pbVar3 = _devIdx_1;
        pPVar1 = alsaApi->allocations;
        pcVar29[-8] = -0x57;
        pcVar29[-7] = -0x2e;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        sVar11 = strlen((char *)pbVar3);
        pcVar29[-8] = -0x4b;
        pcVar29[-7] = -0x2e;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        pcVar12 = (char *)PaUtil_GroupAllocateMemory(pPVar1,sVar11 + 1);
        pbVar3 = _devIdx_1;
        if (pcVar12 == (char *)0x0) {
          pcVar10 = 
          "Expression \'deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 1 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1400\n"
          ;
          goto LAB_0010d501;
        }
        pcVar29[-8] = -0x33;
        pcVar29[-7] = -0x2e;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        strcpy(pcVar12,(char *)pbVar3);
        psVar4 = ctl;
        uVar28 = local_80;
        if ((ctl != (snd_ctl_t *)0x0) && (psVar22 = topNode, uVar31 + 1 <= local_80))
        goto LAB_0010d309;
        sVar11 = local_80 << 6;
        pcVar29[-8] = -0xf;
        pcVar29[-7] = -0x2e;
        pcVar29[-6] = '\x10';
        pcVar29[-5] = '\0';
        pcVar29[-4] = '\0';
        pcVar29[-3] = '\0';
        pcVar29[-2] = '\0';
        pcVar29[-1] = '\0';
        ctl = (snd_ctl_t *)realloc(psVar4,sVar11);
        if (ctl == (snd_ctl_t *)0x0) {
          pcVar10 = 
          "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1408\n"
          ;
          PVar21 = -0x2708;
          goto LAB_0010d501;
        }
        local_80 = uVar28 * 2;
        psVar22 = topNode;
        goto LAB_0010d309;
      }
      pcVar10 = *(char **)((long)&IgnorePlugin_ignoredPlugins + lVar30);
      pcVar29[-8] = 'M';
      pcVar29[-7] = -0x2e;
      pcVar29[-6] = '\x10';
      pcVar29[-5] = '\0';
      pcVar29[-4] = '\0';
      pcVar29[-3] = '\0';
      pcVar29[-2] = '\0';
      pcVar29[-1] = '\0';
      iVar6 = strcmp((char *)pbVar3,pcVar10);
      lVar30 = lVar30 + 8;
      pPVar15 = local_78;
      pPVar5 = local_60;
    } while (iVar6 != 0);
  }
  goto LAB_0010d181;
  while( true ) {
    pcVar29[-8] = '\x1a';
    pcVar29[-7] = -0x2d;
    pcVar29[-6] = '\x10';
    pcVar29[-5] = '\0';
    pcVar29[-4] = '\0';
    pcVar29[-3] = '\0';
    pcVar29[-2] = '\0';
    pcVar29[-1] = '\0';
    iVar6 = strcmp(pcVar10,pcVar2);
    psVar22 = psVar22 + 0x20;
    if (iVar6 == 0) break;
LAB_0010d309:
    pcVar2 = *(char **)(psVar22 + 0x20);
    if (pcVar2 == (char *)0x0) {
      psVar22 = (snd_config_t *)0x0;
      break;
    }
  }
  psVar4 = ctl;
  lVar30 = uVar31 * 0x20;
  *(char **)(ctl + lVar30) = pcVar10;
  *(char **)(ctl + lVar30 + 8) = pcVar12;
  *(undefined4 *)(ctl + lVar30 + 0x10) = 1;
  if (psVar22 == (snd_config_t *)0x0) {
    *(undefined4 *)(ctl + lVar30 + 0x14) = 1;
    pcVar29[-8] = '\x01';
    pcVar29[-7] = '\0';
    pcVar29[-6] = '\0';
    pcVar29[-5] = '\0';
    pcVar29[-4] = '\0';
    pcVar29[-3] = '\0';
    pcVar29[-2] = '\0';
    pcVar29[-1] = '\0';
    uVar20 = (undefined4)*(undefined8 *)(pcVar29 + -8);
  }
  else {
    *(undefined4 *)(ctl + lVar30 + 0x14) = *(undefined4 *)(psVar22 + 0x14);
    uVar20 = *(undefined4 *)(psVar22 + 0x18);
  }
  *(undefined4 *)(psVar4 + lVar30 + 0x18) = uVar20;
  pPVar15 = local_78;
  pPVar5 = local_60;
  uVar31 = uVar31 + 1;
  goto LAB_0010d181;
}

Assistant:

static PaError BuildDeviceList( PaAlsaHostApiRepresentation *alsaApi )
{
    PaUtilHostApiRepresentation *baseApi = &alsaApi->baseHostApiRep;
    PaAlsaDeviceInfo *deviceInfoArray;
    int cardIdx = -1, devIdx = 0;
    snd_ctl_card_info_t *cardInfo;
    PaError result = paNoError;
    size_t numDeviceNames = 0, maxDeviceNames = 1, i;
    HwDevInfo *hwDevInfos = NULL;
    snd_config_t *topNode = NULL;
    snd_pcm_info_t *pcmInfo;
    int res;
    int blocking = SND_PCM_NONBLOCK;
    int usePlughw = 0;
    char *hwPrefix = "";
    char alsaCardName[50];
#ifdef PA_ENABLE_DEBUG_OUTPUT
    PaTime startTime = PaUtil_GetTime();
#endif

    if( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) && atoi( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) ) )
        blocking = 0;

    /* If PA_ALSA_PLUGHW is 1 (non-zero), use the plughw: pcm throughout instead of hw: */
    if( getenv( "PA_ALSA_PLUGHW" ) && atoi( getenv( "PA_ALSA_PLUGHW" ) ) )
    {
        usePlughw = 1;
        hwPrefix = "plug";
        PA_DEBUG(( "%s: Using Plughw\n", __FUNCTION__ ));
    }

    /* These two will be set to the first working input and output device, respectively */
    baseApi->info.defaultInputDevice = paNoDevice;
    baseApi->info.defaultOutputDevice = paNoDevice;

    /* Gather info about hw devices

     * alsa_snd_card_next() modifies the integer passed to it to be:
     *      the index of the first card if the parameter is -1
     *      the index of the next card if the parameter is the index of a card
     *      -1 if there are no more cards
     *
     * The function itself returns 0 if it succeeded. */
    cardIdx = -1;
    alsa_snd_ctl_card_info_alloca( &cardInfo );
    alsa_snd_pcm_info_alloca( &pcmInfo );
    while( alsa_snd_card_next( &cardIdx ) == 0 && cardIdx >= 0 )
    {
        char *cardName;
        int devIdx = -1;
        snd_ctl_t *ctl;
        char buf[50];

        snprintf( alsaCardName, sizeof (alsaCardName), "hw:%d", cardIdx );

        /* Acquire name of card */
        if( alsa_snd_ctl_open( &ctl, alsaCardName, 0 ) < 0 )
        {
            /* Unable to open card :( */
            PA_DEBUG(( "%s: Unable to open device %s\n", __FUNCTION__, alsaCardName ));
            continue;
        }
        alsa_snd_ctl_card_info( ctl, cardInfo );

        PA_ENSURE( PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo )) );

        while( alsa_snd_ctl_pcm_next_device( ctl, &devIdx ) == 0 && devIdx >= 0 )
        {
            char *alsaDeviceName, *deviceName, *infoName;
            size_t len;
            int hasPlayback = 0, hasCapture = 0;

            snprintf( buf, sizeof (buf), "%s%s,%d", hwPrefix, alsaCardName, devIdx );

            /* Obtain info about this particular device */
            alsa_snd_pcm_info_set_device( pcmInfo, devIdx );
            alsa_snd_pcm_info_set_subdevice( pcmInfo, 0 );
            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_CAPTURE );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasCapture = 1;
            }

            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_PLAYBACK );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasPlayback = 1;
            }

            if( !hasPlayback && !hasCapture )
            {
                /* Error */
                continue;
            }

            infoName = SkipCardDetailsInName( (char *)alsa_snd_pcm_info_get_name( pcmInfo ), cardName );

            /* The length of the string written by snprintf plus terminating 0 */
            len = snprintf( NULL, 0, "%s: %s (%s)", cardName, infoName, buf ) + 1;
            PA_UNLESS( deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len ),
                    paInsufficientMemory );
            snprintf( deviceName, len, "%s: %s (%s)", cardName, infoName, buf );

            PA_DEBUG(( "%s: Found device [%d]: %s\n", __FUNCTION__, numDeviceNames, deviceName ));

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            PA_ENSURE( PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf ) );

            hwDevInfos[ numDeviceNames - 1 ].alsaName = alsaDeviceName;
            hwDevInfos[ numDeviceNames - 1 ].name = deviceName;
            hwDevInfos[ numDeviceNames - 1 ].isPlug = usePlughw;
            hwDevInfos[ numDeviceNames - 1 ].hasPlayback = hasPlayback;
            hwDevInfos[ numDeviceNames - 1 ].hasCapture = hasCapture;
        }
        alsa_snd_ctl_close( ctl );
    }

    /* Iterate over plugin devices */
    if( NULL == (*alsa_snd_config) )
    {
        /* alsa_snd_config_update is called implicitly by some functions, if this hasn't happened snd_config will be NULL (bleh) */
        ENSURE_( alsa_snd_config_update(), paUnanticipatedHostError );
        PA_DEBUG(( "Updating snd_config\n" ));
    }
    assert( *alsa_snd_config );
    if( ( res = alsa_snd_config_search( *alsa_snd_config, "pcm", &topNode ) ) >= 0 )
    {
        snd_config_iterator_t i, next;

        alsa_snd_config_for_each( i, next, topNode )
        {
            const char *tpStr = "unknown", *idStr = NULL;
            int err = 0;

            char *alsaDeviceName, *deviceName;
            const HwDevInfo *predefined = NULL;
            snd_config_t *n = alsa_snd_config_iterator_entry( i ), * tp = NULL;;

            if( (err = alsa_snd_config_search( n, "type", &tp )) < 0 )
            {
                if( -ENOENT != err )
                {
                    ENSURE_(err, paUnanticipatedHostError);
                }
            }
            else
            {
                ENSURE_( alsa_snd_config_get_string( tp, &tpStr ), paUnanticipatedHostError );
            }
            ENSURE_( alsa_snd_config_get_id( n, &idStr ), paUnanticipatedHostError );
            if( IgnorePlugin( idStr ) )
            {
                PA_DEBUG(( "%s: Ignoring ALSA plugin device [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));
                continue;
            }
            PA_DEBUG(( "%s: Found plugin [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));

            PA_UNLESS( alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 6 ), paInsufficientMemory );
            strcpy( alsaDeviceName, idStr );
            PA_UNLESS( deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 1 ), paInsufficientMemory );
            strcpy( deviceName, idStr );

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            predefined = FindDeviceName( alsaDeviceName );

            hwDevInfos[numDeviceNames - 1].alsaName = alsaDeviceName;
            hwDevInfos[numDeviceNames - 1].name     = deviceName;
            hwDevInfos[numDeviceNames - 1].isPlug   = 1;

            if( predefined )
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = predefined->hasPlayback;
                hwDevInfos[numDeviceNames - 1].hasCapture  = predefined->hasCapture;
            }
            else
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = 1;
                hwDevInfos[numDeviceNames - 1].hasCapture  = 1;
            }
        }
    }
    else
        PA_DEBUG(( "%s: Iterating over ALSA plugins failed: %s\n", __FUNCTION__, alsa_snd_strerror( res ) ));

    /* allocate deviceInfo memory based on the number of devices */
    PA_UNLESS( baseApi->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) ), paInsufficientMemory );

    /* allocate all device info structs in a contiguous block */
    PA_UNLESS( deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames ), paInsufficientMemory );

    /* Loop over list of cards, filling in info. If a device is deemed unavailable (can't get name),
     * it's ignored.
     *
     * Note that we do this in two stages. This is a workaround owing to the fact that the 'dmix'
     * plugin may cause the underlying hardware device to be busy for a short while even after it
     * (dmix) is closed. The 'default' plugin may also point to the dmix plugin, so the same goes
     * for this.
     */
    PA_DEBUG(( "%s: Filling device info for %d devices\n", __FUNCTION__, numDeviceNames ));
    for( i = 0, devIdx = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( !strcmp( hwInfo->name, "dmix" ) || !strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx ) );
    }
    assert( devIdx <= numDeviceNames );
    /* Now inspect 'dmix' and 'default' plugins */
    for( i = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( strcmp( hwInfo->name, "dmix" ) && strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx ) );
    }
    free( hwDevInfos );

    baseApi->info.deviceCount = devIdx;   /* Number of successfully queried devices */

#ifdef PA_ENABLE_DEBUG_OUTPUT
    PA_DEBUG(( "%s: Building device list took %f seconds\n", __FUNCTION__, PaUtil_GetTime() - startTime ));
#endif

end:
    return result;

error:
    /* No particular action */
    goto end;
}